

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O3

ans_reorder_fold_decode<3U> *
ans_reorder_fold_decode<3U>::load
          (ans_reorder_fold_decode<3U> *__return_storage_ptr__,uint8_t *in_u8)

{
  pointer puVar1;
  pointer puVar2;
  pointer pdVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  byte bVar8;
  byte bVar9;
  pointer puVar10;
  void *__s;
  uint64_t uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint8_t *in_u8_00;
  uint uVar19;
  ushort uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 extraout_var [56];
  undefined1 auVar27 [64];
  undefined1 in_XMM7 [16];
  undefined1 local_48 [16];
  pointer local_38;
  
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar16 = *(int *)in_u8;
  __s = operator_new(0x1000);
  in_u8_00 = in_u8 + 4;
  memset(__s,0,0x1000);
  if (iVar16 == 1) {
    memcpy(__s,in_u8_00,0x1000);
    in_u8_00 = in_u8 + 0x1004;
  }
  else {
    auVar22 = vpmovsxbd_avx512f(_DAT_001a1400);
    auVar23 = vpbroadcastd_avx512f(ZEXT416(0x10));
    lVar12 = 0;
    do {
      auVar24 = vmovdqu64_avx512f(auVar22);
      *(undefined1 (*) [64])((long)__s + lVar12 * 4) = auVar24;
      lVar12 = lVar12 + 0x10;
      auVar22 = vpaddd_avx512f(auVar22,auVar23);
    } while (lVar12 != 0x400);
  }
  ans_load_interp((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,in_u8_00);
  puVar10 = local_38;
  puVar1 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_38 = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar10;
  local_48 = (undefined1  [16])0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    if ((pointer)local_48._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
    }
  }
  puVar1 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    uVar11 = 0;
  }
  else {
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    uVar13 = 0;
    auVar24 = vpbroadcastq_avx512f();
    auVar24 = vpsrlq_avx512f(auVar24,2);
    do {
      auVar25 = vpbroadcastq_avx512f();
      auVar26 = vmovdqa64_avx512f(auVar27);
      auVar27 = vporq_avx512f(auVar25,auVar22);
      auVar25 = vporq_avx512f(auVar25,auVar23);
      uVar7 = vpcmpuq_avx512f(auVar25,auVar24,2);
      bVar8 = (byte)uVar7;
      uVar7 = vpcmpuq_avx512f(auVar27,auVar24,2);
      bVar9 = (byte)uVar7;
      uVar20 = CONCAT11(bVar9,bVar8);
      auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar1 + uVar13));
      auVar25._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar27._4_4_;
      auVar25._0_4_ = (uint)(bVar8 & 1) * auVar27._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar27._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar27._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar27._16_4_;
      auVar25._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar27._20_4_;
      auVar25._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar27._24_4_;
      auVar25._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar27._28_4_;
      auVar25._32_4_ = (uint)(bVar9 & 1) * auVar27._32_4_;
      auVar25._36_4_ = (uint)(bVar9 >> 1 & 1) * auVar27._36_4_;
      auVar25._40_4_ = (uint)(bVar9 >> 2 & 1) * auVar27._40_4_;
      auVar25._44_4_ = (uint)(bVar9 >> 3 & 1) * auVar27._44_4_;
      auVar25._48_4_ = (uint)(bVar9 >> 4 & 1) * auVar27._48_4_;
      auVar25._52_4_ = (uint)(bVar9 >> 5 & 1) * auVar27._52_4_;
      auVar25._56_4_ = (uint)(bVar9 >> 6 & 1) * auVar27._56_4_;
      auVar25._60_4_ = (uint)(bVar9 >> 7) * auVar27._60_4_;
      uVar13 = uVar13 + 0x10;
      auVar27 = vpaddd_avx512f(auVar25,auVar26);
    } while ((((ulong)((long)puVar2 + (-4 - (long)puVar1)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar13);
    auVar22 = vmovdqa32_avx512f(auVar27);
    auVar23._0_4_ = (uint)(bVar8 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar8 & 1) * auVar26._0_4_;
    bVar4 = (bool)((byte)(uVar20 >> 1) & 1);
    auVar23._4_4_ = (uint)bVar4 * auVar22._4_4_ | (uint)!bVar4 * auVar26._4_4_;
    bVar4 = (bool)((byte)(uVar20 >> 2) & 1);
    auVar23._8_4_ = (uint)bVar4 * auVar22._8_4_ | (uint)!bVar4 * auVar26._8_4_;
    bVar4 = (bool)((byte)(uVar20 >> 3) & 1);
    auVar23._12_4_ = (uint)bVar4 * auVar22._12_4_ | (uint)!bVar4 * auVar26._12_4_;
    bVar4 = (bool)((byte)(uVar20 >> 4) & 1);
    auVar23._16_4_ = (uint)bVar4 * auVar22._16_4_ | (uint)!bVar4 * auVar26._16_4_;
    bVar4 = (bool)((byte)(uVar20 >> 5) & 1);
    auVar23._20_4_ = (uint)bVar4 * auVar22._20_4_ | (uint)!bVar4 * auVar26._20_4_;
    bVar4 = (bool)((byte)(uVar20 >> 6) & 1);
    auVar23._24_4_ = (uint)bVar4 * auVar22._24_4_ | (uint)!bVar4 * auVar26._24_4_;
    bVar4 = (bool)((byte)(uVar20 >> 7) & 1);
    auVar23._28_4_ = (uint)bVar4 * auVar22._28_4_ | (uint)!bVar4 * auVar26._28_4_;
    auVar23._32_4_ = (uint)(bVar9 & 1) * auVar22._32_4_ | (uint)!(bool)(bVar9 & 1) * auVar26._32_4_;
    bVar4 = (bool)(bVar9 >> 1 & 1);
    auVar23._36_4_ = (uint)bVar4 * auVar22._36_4_ | (uint)!bVar4 * auVar26._36_4_;
    bVar4 = (bool)(bVar9 >> 2 & 1);
    auVar23._40_4_ = (uint)bVar4 * auVar22._40_4_ | (uint)!bVar4 * auVar26._40_4_;
    bVar4 = (bool)(bVar9 >> 3 & 1);
    auVar23._44_4_ = (uint)bVar4 * auVar22._44_4_ | (uint)!bVar4 * auVar26._44_4_;
    bVar4 = (bool)(bVar9 >> 4 & 1);
    auVar23._48_4_ = (uint)bVar4 * auVar22._48_4_ | (uint)!bVar4 * auVar26._48_4_;
    bVar4 = (bool)(bVar9 >> 5 & 1);
    auVar23._52_4_ = (uint)bVar4 * auVar22._52_4_ | (uint)!bVar4 * auVar26._52_4_;
    bVar4 = (bool)(bVar9 >> 6 & 1);
    auVar23._56_4_ = (uint)bVar4 * auVar22._56_4_ | (uint)!bVar4 * auVar26._56_4_;
    auVar23._60_4_ =
         (uint)(bVar9 >> 7) * auVar22._60_4_ | (uint)!(bool)(bVar9 >> 7) * auVar26._60_4_;
    auVar21 = vextracti64x4_avx512f(auVar23,1);
    auVar22 = vpaddd_avx512f(auVar23,ZEXT3264(auVar21));
    auVar5 = vpaddd_avx(auVar22._0_16_,auVar22._16_16_);
    auVar6 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    auVar6 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpaddd_avx(auVar5,auVar6);
    uVar11 = (uint64_t)auVar5._0_4_;
  }
  auVar5 = vcvtusi2sd_avx512f(in_XMM7,uVar11);
  __return_storage_ptr__->frame_size = uVar11;
  __return_storage_ptr__->frame_mask = uVar11 - 1;
  auVar22._0_8_ = log2(auVar5._0_8_);
  auVar22._8_56_ = extraout_var;
  uVar11 = vcvttsd2usi_avx512f(auVar22._0_16_);
  __return_storage_ptr__->frame_log2 = uVar11;
  std::vector<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>::resize
            (&__return_storage_ptr__->table,__return_storage_ptr__->frame_size);
  puVar1 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (__return_storage_ptr__->table).
           super__Vector_base<dec_entry_reorder_fold,_std::allocator<dec_entry_reorder_fold>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar12 = (long)(__return_storage_ptr__->nfreqs).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  lVar15 = 0;
  iVar16 = 0;
  do {
    uVar14 = (uint)lVar15;
    if (uVar14 < 0x400) {
      iVar18 = 0;
      iVar17 = *(int *)((long)__s + (ulong)(uVar14 & 0x3ff) * 4) + 0x400;
    }
    else {
      uVar19 = uVar14 - 0x400;
      iVar18 = (uVar19 / 0x3fc) * 0x40000000 + 0x40000000;
      iVar17 = (uVar19 / 0x3fc + 1) * -0x3fc + uVar14 << ((ulong)((uVar19 / 0x3fc) * 8 + 8) & 0x3f);
    }
    uVar14 = puVar1[lVar15];
    if ((ulong)uVar14 == 0) {
      uVar14 = 0;
    }
    else {
      uVar13 = 0;
      do {
        uVar19 = iVar16 + (int)uVar13;
        pdVar3[uVar19].freq = (uint16_t)uVar14;
        pdVar3[uVar19].mapped_num = iVar17 + iVar18;
        pdVar3[uVar19].offset = (uint16_t)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
      uVar14 = puVar1[lVar15];
    }
    iVar16 = iVar16 + uVar14;
    lVar15 = lVar15 + 1;
  } while (lVar15 != lVar12 + (ulong)(lVar12 == 0));
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  operator_delete(__s,0x1000);
  return __return_storage_ptr__;
}

Assistant:

static ans_reorder_fold_decode load(const uint8_t* in_u8)
    {
        ans_reorder_fold_decode model;
        auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
        in_u8 += sizeof(uint32_t);
        uint32_t do_reorder = *in_ptr_u32++;
        size_t no_except_thres = 1 << (fidelity + 8 - 1);
        std::vector<uint32_t> most_frequent(no_except_thres);
        if (do_reorder == 1) {
            for (size_t i = 0; i < no_except_thres; i++) {
                most_frequent[i] = *in_ptr_u32++;
            }
            in_u8 += no_except_thres * sizeof(uint32_t);
        } else {
            for (size_t i = 0; i < no_except_thres; i++) {
                most_frequent[i] = i;
            }
        }

        model.nfreqs = ans_load_interp(in_u8);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        for (size_t sym = 0; sym <= max_sym; sym++) {
            auto cur_freq = model.nfreqs[sym];
            uint32_t except_bytes
                = ans_reorder_fold_exception_bytes<fidelity>(sym);
            uint32_t mapped_num
                = ans_reorder_fold_undo_mapping<fidelity>(most_frequent, sym)
                + (except_bytes << 30);
            for (uint32_t k = 0; k < cur_freq; k++) {
                model.table[cur_base + k].freq = cur_freq;
                model.table[cur_base + k].mapped_num = mapped_num;
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }